

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O0

void duckdb::SinkDataChunk
               (Vector *child_vector,SelectionVector *sel,idx_t offset_lists_indices,
               vector<duckdb::LogicalType,_true> *types,
               vector<duckdb::LogicalType,_true> *payload_types,Vector *payload_vector,
               LocalSortState *local_sort_state,bool *data_to_sort,Vector *lists_indices)

{
  reference this;
  reference this_00;
  idx_t in_RDX;
  undefined1 *in_stack_00000010;
  DataChunk payload_chunk;
  DataChunk key_chunk;
  Vector slice;
  size_type in_stack_fffffffffffffeb8;
  DataChunk *in_stack_fffffffffffffec0;
  pointer in_stack_fffffffffffffed8;
  pointer in_stack_fffffffffffffee0;
  pointer in_stack_fffffffffffffee8;
  SelectionVector *in_stack_fffffffffffffef0;
  Vector *in_stack_fffffffffffffef8;
  Vector *in_stack_ffffffffffffff00;
  Vector *in_stack_ffffffffffffff08;
  Vector *in_stack_ffffffffffffff10;
  DataChunk local_d8 [3];
  idx_t local_18;
  
  local_18 = in_RDX;
  Vector::Vector(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 (idx_t)in_stack_fffffffffffffee8);
  DataChunk::DataChunk(in_stack_fffffffffffffec0);
  DataChunk::InitializeEmpty
            ((DataChunk *)in_stack_fffffffffffffee0,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffed8);
  this = vector<duckdb::Vector,_true>::operator[]
                   (&in_stack_fffffffffffffec0->data,in_stack_fffffffffffffeb8);
  Vector::Reference(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  vector<duckdb::Vector,_true>::operator[]
            (&in_stack_fffffffffffffec0->data,in_stack_fffffffffffffeb8);
  Vector::Reference(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  DataChunk::SetCardinality(local_d8,local_18);
  DataChunk::DataChunk(in_stack_fffffffffffffec0);
  DataChunk::InitializeEmpty
            ((DataChunk *)in_stack_fffffffffffffee0,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffed8);
  this_00 = vector<duckdb::Vector,_true>::operator[]
                      (&in_stack_fffffffffffffec0->data,in_stack_fffffffffffffeb8);
  Vector::Reference(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  DataChunk::SetCardinality((DataChunk *)&stack0xfffffffffffffed8,local_18);
  DataChunk::Verify(local_d8);
  DataChunk::Verify((DataChunk *)&stack0xfffffffffffffed8);
  DataChunk::Flatten((DataChunk *)this);
  LocalSortState::SinkChunk
            ((LocalSortState *)payload_types,(DataChunk *)payload_vector,
             (DataChunk *)
             slice.auxiliary.internal.
             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ;
  *in_stack_00000010 = 1;
  DataChunk::~DataChunk((DataChunk *)this_00);
  DataChunk::~DataChunk((DataChunk *)this_00);
  Vector::~Vector(this_00);
  return;
}

Assistant:

void SinkDataChunk(Vector *child_vector, SelectionVector &sel, idx_t offset_lists_indices, vector<LogicalType> &types,
                   vector<LogicalType> &payload_types, Vector &payload_vector, LocalSortState &local_sort_state,
                   bool &data_to_sort, Vector &lists_indices) {

	// slice the child vector
	Vector slice(*child_vector, sel, offset_lists_indices);

	// initialize and fill key_chunk
	DataChunk key_chunk;
	key_chunk.InitializeEmpty(types);
	key_chunk.data[0].Reference(lists_indices);
	key_chunk.data[1].Reference(slice);
	key_chunk.SetCardinality(offset_lists_indices);

	// initialize and fill key_chunk and payload_chunk
	DataChunk payload_chunk;
	payload_chunk.InitializeEmpty(payload_types);
	payload_chunk.data[0].Reference(payload_vector);
	payload_chunk.SetCardinality(offset_lists_indices);

	key_chunk.Verify();
	payload_chunk.Verify();

	// sink
	key_chunk.Flatten();
	local_sort_state.SinkChunk(key_chunk, payload_chunk);
	data_to_sort = true;
}